

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlParserCtxtGetErrorHandler(PyObject *self,PyObject *args)

{
  undefined8 *puVar1;
  int iVar2;
  undefined *in_RAX;
  PyObject *pPVar3;
  long lVar4;
  long *plVar5;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  pPVar3 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:xmlParserCtxtGetErrorHandler",&local_18);
  if (iVar2 != 0) {
    if (local_18 == &_Py_NoneStruct) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(local_18 + 0x10);
    }
    pPVar3 = (PyObject *)PyTuple_New(2);
    puVar1 = *(undefined8 **)(lVar4 + 0x1a8);
    if (puVar1 == (undefined8 *)0x0) {
      plVar5 = (long *)&_Py_NoneStruct;
      PyTuple_SetItem(pPVar3,0,&_Py_NoneStruct);
      __Py_NoneStruct = __Py_NoneStruct + 1;
      PyTuple_SetItem(pPVar3,1,&_Py_NoneStruct);
    }
    else {
      PyTuple_SetItem(pPVar3,0,*puVar1);
      plVar5 = (long *)*puVar1;
      if (plVar5 != (long *)0x0) {
        *plVar5 = *plVar5 + 1;
      }
      PyTuple_SetItem(pPVar3,1,puVar1[1]);
      plVar5 = (long *)puVar1[1];
      if (plVar5 == (long *)0x0) {
        return pPVar3;
      }
    }
    *plVar5 = *plVar5 + 1;
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlParserCtxtGetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) 
{
    PyObject *py_retval;
    xmlParserCtxtPtr ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_ctxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParserCtxtGetErrorHandler",
		          &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);
    py_retval = PyTuple_New(2);
    if (ctxt->_private != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)ctxt->_private;

	PyTuple_SetItem(py_retval, 0, pyCtxt->f);
	Py_XINCREF(pyCtxt->f);
	PyTuple_SetItem(py_retval, 1, pyCtxt->arg);
	Py_XINCREF(pyCtxt->arg);
    }
    else {
	/* no python error handler registered */
	PyTuple_SetItem(py_retval, 0, Py_None);
	Py_XINCREF(Py_None);
	PyTuple_SetItem(py_retval, 1, Py_None);
	Py_XINCREF(Py_None);
    }
    return(py_retval);
}